

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_2::anon_unknown_0::readRgba(RgbaInputFile *in,bool reduceMemory,bool reduceTime)

{
  int iVar1;
  Header *pHVar2;
  Box2i *dw_00;
  Compression *pCVar3;
  Array<Imf_3_2::Rgba> *this;
  byte in_DL;
  byte in_SIL;
  Rgba *in_RDI;
  int y;
  int step;
  intptr_t base;
  Array<Imf_3_2::Rgba> pixels;
  uint64_t numLines;
  uint64_t bytesPerPixel;
  int dx;
  uint64_t w;
  Box2i *dw;
  int part;
  bool threw;
  undefined1 reduceTime_00;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar4;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  Array local_60 [16];
  long local_50;
  long local_48;
  int local_3c;
  long local_38;
  int *local_20;
  int local_18;
  byte local_13;
  byte local_12;
  byte local_11;
  Rgba *local_10;
  byte local_1;
  
  local_11 = in_SIL & 1;
  local_12 = in_DL & 1;
  local_13 = 0;
  local_18 = 0;
  local_10 = in_RDI;
  do {
    iVar4 = local_18;
    iVar1 = Imf_3_2::RgbaInputFile::parts();
    if (iVar1 <= iVar4) {
      local_1 = local_13 & 1;
LAB_00118b75:
      return (bool)(local_1 & 1);
    }
    Imf_3_2::RgbaInputFile::setPart((int)local_10);
    local_20 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
    local_38 = ((long)local_20[2] - (long)*local_20) + 1;
    local_3c = *local_20;
    pHVar2 = (Header *)Imf_3_2::RgbaInputFile::header();
    local_48 = Imf_3_2::calculateBytesPerPixel(pHVar2);
    dw_00 = (Box2i *)Imf_3_2::RgbaInputFile::header();
    pCVar3 = (Compression *)Imf_3_2::Header::compression();
    iVar1 = Imf_3_2::numLinesInBuffer(*pCVar3);
    reduceTime_00 = (undefined1)((ulong)pCVar3 >> 0x38);
    local_50 = (long)iVar1;
    if (((local_11 & 1) != 0) && (8000000 < (ulong)(local_38 * local_48 * local_50))) {
      local_1 = 0;
      goto LAB_00118b75;
    }
    Array<Imf_3_2::Rgba>::Array
              ((Array<Imf_3_2::Rgba> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
               ,CONCAT44(in_stack_ffffffffffffff8c,iVar4));
    this = (Array<Imf_3_2::Rgba> *)Array::operator_cast_to_Rgba_(local_60);
    Imf_3_2::RgbaInputFile::setFrameBuffer(local_10,(ulong)((long)this + (long)local_3c * -8),1);
    in_stack_ffffffffffffff94 = getStep(dw_00,(bool)reduceTime_00);
    for (in_stack_ffffffffffffff90 = local_20[1]; in_stack_ffffffffffffff90 <= local_20[3];
        in_stack_ffffffffffffff90 = in_stack_ffffffffffffff94 + in_stack_ffffffffffffff90) {
      Imf_3_2::RgbaInputFile::readPixels((int)local_10);
    }
    iVar4 = 0;
    Array<Imf_3_2::Rgba>::~Array(this);
    if (iVar4 != 0) goto LAB_00118b75;
    local_18 = local_18 + 1;
    in_stack_ffffffffffffff8c = 0;
  } while( true );
}

Assistant:

bool
readRgba (RgbaInputFile& in, bool reduceMemory, bool reduceTime)
{

    bool threw = false;

    for (int part = 0; part < in.parts (); ++part)
    {
        in.setPart (part);
        try
        {
            const Box2i& dw = in.dataWindow ();

            uint64_t w = static_cast<uint64_t> (dw.max.x) -
                         static_cast<uint64_t> (dw.min.x) + 1;
            int      dx            = dw.min.x;
            uint64_t bytesPerPixel = calculateBytesPerPixel (in.header ());
            uint64_t numLines = numLinesInBuffer (in.header ().compression ());

            if (reduceMemory &&
                w * bytesPerPixel * numLines > gMaxBytesPerScanline)
            {
                return false;
            }

            Array<Rgba> pixels (w);
            intptr_t    base = reinterpret_cast<intptr_t> (&pixels[0]);
            in.setFrameBuffer (
                reinterpret_cast<Rgba*> (base - dx * sizeof (Rgba)), 1, 0);

            int step = getStep (dw, reduceTime);

            //
            // try reading scanlines. Continue reading scanlines
            // even if an exception is encountered
            //
            for (int y = dw.min.y; y <= dw.max.y; y += step)
            {
                try
                {
                    in.readPixels (y);
                }
                catch (...)
                {
                    threw = true;

                    //
                    // in reduceTime mode, fail immediately - the file is corrupt
                    //
                    if (reduceTime) { return threw; }
                }
            }
        }
        catch (...)
        {
            threw = true;
        }
    }
    return threw;
}